

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_varbuff_to_bytes
              (uchar *bytes,size_t bytes_len,uchar *bytes_out,size_t len,size_t *written)

{
  size_t sVar1;
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (((((bytes != (uchar *)0x0) == (bytes_len != 0)) && (bytes_out != (uchar *)0x0)) &&
      (sVar1 = varint_get_length(bytes_len), sVar1 + bytes_len <= len)) &&
     (written != (size_t *)0x0)) {
    sVar1 = varbuff_to_bytes(bytes,bytes_len,bytes_out);
    *written = sVar1;
    return 0;
  }
  return -2;
}

Assistant:

int wally_varbuff_to_bytes(const unsigned char *bytes, size_t bytes_len,
                           unsigned char *bytes_out, size_t len, size_t *written)
{
    if (written)
        *written = 0;
    if (BYTES_INVALID(bytes, bytes_len) || !bytes_out ||
        len < varint_get_length(bytes_len) + bytes_len || !written)
        return WALLY_EINVAL;
    *written = varbuff_to_bytes(bytes, bytes_len, bytes_out);
    return WALLY_OK;
}